

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall logloss::getLoss(logloss *this,shared_data *param_2,float prediction,float label)

{
  ostream *poVar1;
  float in_XMM0_Da;
  double dVar2;
  float in_XMM1_Da;
  
  if (((in_XMM1_Da != -1.0) || (NAN(in_XMM1_Da))) && ((in_XMM1_Da != 1.0 || (NAN(in_XMM1_Da))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"You are using label ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Da);
    poVar1 = std::operator<<(poVar1," not -1 or 1 as loss function expects!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  dVar2 = std::exp((double)(ulong)(uint)(-in_XMM1_Da * in_XMM0_Da));
  dVar2 = std::log((double)(ulong)(uint)(SUB84(dVar2,0) + 1.0));
  return SUB84(dVar2,0);
}

Assistant:

float getLoss(shared_data*, float prediction, float label)
  {
    if (label != -1.f && label != 1.f)
      cout << "You are using label " << label << " not -1 or 1 as loss function expects!" << endl;
    return log(1 + correctedExp(-label * prediction));
  }